

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

_Bool get_int_from_string(char *s,int *val)

{
  _Bool _Var1;
  long lVar2;
  long lval;
  char *endptr;
  int *val_local;
  char *s_local;
  
  endptr = (char *)val;
  val_local = (int *)s;
  lVar2 = strtol(s,(char **)&lval,10);
  if ((((char)*val_local == '\0') ||
      (((*(char *)lval != '\0' && (_Var1 = contains_only_spaces((char *)lval), !_Var1)) ||
       (lVar2 < -0x7fffffff)))) || (0x7ffffffe < lVar2)) {
    s_local._7_1_ = false;
  }
  else {
    *(int *)endptr = (int)lVar2;
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool get_int_from_string(const char *s, int *val)
{
	char *endptr;
	long lval = strtol(s, &endptr, 10);

	/*
	 * Reject INT_MIN and INT_MAX so, for systems where
	 * sizeof(long) == sizeof(int), it isn't necessary to check errno to
	 * see if the value in the string was out of range.
	 */
	if (s[0] == '\0' ||
			(*endptr != '\0' && !contains_only_spaces(endptr)) ||
			lval <= INT_MIN || lval >= INT_MAX) {
		return false;
	}
	*val = (int)lval;
	return true;
}